

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  key_type kVar4;
  key_type kVar5;
  key_type kVar6;
  key_type kVar7;
  key_type kVar8;
  key_type kVar9;
  value_type actual_predicate_value;
  AssertHelper *this_00;
  value_type vVar10;
  char *pcVar11;
  size_type sVar12;
  bool *success;
  long in_RDI;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  TypeParam ht_in;
  AssertionResult gtest_ar_;
  stringstream string_buffer;
  int i;
  TypeParam ht_out;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8c8;
  undefined4 in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d4;
  pair<const_int,_int> *in_stack_fffffffffffff8d8;
  int iVar13;
  undefined4 in_stack_fffffffffffff8e0;
  undefined4 in_stack_fffffffffffff8e4;
  char *in_stack_fffffffffffff8e8;
  int line;
  undefined4 in_stack_fffffffffffff8f0;
  undefined4 in_stack_fffffffffffff8f4;
  undefined8 in_stack_fffffffffffff8f8;
  Type TVar14;
  AssertHelper *in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff934;
  char *in_stack_fffffffffffff938;
  undefined6 in_stack_fffffffffffff940;
  undefined1 in_stack_fffffffffffff946;
  value_type in_stack_fffffffffffff950;
  key_type *key;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  string local_678 [48];
  key_type local_648;
  undefined1 local_641;
  AssertionResult local_640;
  string local_630 [48];
  key_type local_600;
  undefined1 local_5f9;
  value_type *in_stack_fffffffffffffa08;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffa10;
  AssertionResult local_578;
  string local_568 [48];
  key_type local_538;
  undefined1 local_531;
  AssertionResult local_530 [2];
  key_type local_50c;
  value_type local_4b8;
  AssertionResult local_4b0 [2];
  key_type local_48c;
  value_type local_438;
  AssertionResult local_430;
  string local_420 [55];
  undefined1 local_3e9;
  AssertionResult local_3e8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_3d8 [2];
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_3b0;
  string local_318 [55];
  undefined1 local_2e1;
  AssertionResult local_2e0;
  stringstream local_2d0 [392];
  key_type local_148;
  key_type local_144;
  value_type local_e4;
  int local_dc;
  key_type local_d8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_c8;
  undefined1 local_b8 [184];
  
  bVar1 = google::
          HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    key = (key_type *)(local_b8 + 0xc);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
               (int)((ulong)in_stack_fffffffffffff8c8 >> 0x20));
    this_01 = (BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)local_b8;
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
               (int)((ulong)in_stack_fffffffffffff8c8 >> 0x20));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_c8,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashMap
              ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
               (size_type)in_stack_fffffffffffff8e8,
               (hasher *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
               (key_equal *)in_stack_fffffffffffff8d8,
               (allocator_type *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_c8);
    local_d8 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                           (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                      (key_type *)in_stack_fffffffffffff8c8);
    for (local_dc = 1; TVar14 = (Type)((ulong)in_stack_fffffffffffff8f8 >> 0x20), local_dc < 100;
        local_dc = local_dc + 1) {
      in_stack_fffffffffffff950 =
           HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff8c8,0);
      local_e4 = in_stack_fffffffffffff950;
      google::
      BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)in_stack_fffffffffffffa10._M_head_impl,in_stack_fffffffffffffa08);
    }
    kVar4 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                        (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
    local_144 = kVar4;
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
            (key_type *)in_stack_fffffffffffff8c8);
    kVar5 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                        (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
    local_148 = kVar5;
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
            (key_type *)in_stack_fffffffffffff8c8);
    std::__cxx11::stringstream::stringstream(local_2d0);
    uVar2 = google::
            BaseHashtableInterface<google::sparse_hash_map<int,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::
            serialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,std::__cxx11::stringstream>
                      ((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)(local_b8 + 0x18),local_2d0);
    local_2e1 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
               (bool *)in_stack_fffffffffffff8c8,(type *)0xf97297);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff900);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(kVar4,kVar5),
                 (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff946,in_stack_fffffffffffff940
                                                )),in_stack_fffffffffffff938,
                 (char *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff900,TVar14,
                 (char *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                 (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffff950,(Message *)CONCAT44(kVar4,kVar5));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      std::__cxx11::string::~string(local_318);
      testing::Message::~Message((Message *)0xf97373);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf9740a);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
               (int)((ulong)in_stack_fffffffffffff8c8 >> 0x20));
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
               (int)((ulong)in_stack_fffffffffffff8c8 >> 0x20));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_3d8,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashMap
              ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
               (size_type)in_stack_fffffffffffff8e8,
               (hasher *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
               (key_equal *)in_stack_fffffffffffff8d8,
               (allocator_type *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_3d8);
    uVar3 = google::
            BaseHashtableInterface<google::sparse_hash_map<int,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::
            unserialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,std::__cxx11::stringstream>
                      (&local_3b0,local_2d0);
    local_3e9 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
               (bool *)in_stack_fffffffffffff8c8,(type *)0xf974b8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff900);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(kVar4,kVar5),
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff940)),
                 in_stack_fffffffffffff938,
                 (char *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff900,TVar14,
                 (char *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                 (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffff950,(Message *)CONCAT44(kVar4,kVar5));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      std::__cxx11::string::~string(local_420);
      testing::Message::~Message((Message *)0xf975cc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf97663);
    actual_predicate_value =
         HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject(in_stack_fffffffffffff8c8,0);
    local_438 = actual_predicate_value;
    kVar6 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                        (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
    local_48c = kVar6;
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(this_01,key);
    google::
    sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf976d8);
    testing::internal::EqHelper::
    Compare<std::pair<const_int,_int>,_std::pair<const_int,_int>,_nullptr>
              (in_stack_fffffffffffff8e8,
               (char *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
               in_stack_fffffffffffff8d8,
               (pair<const_int,_int> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0)
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_430);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff900);
      testing::AssertionResult::failure_message((AssertionResult *)0xf97746);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff900,TVar14,
                 (char *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                 (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffff950,(Message *)CONCAT44(kVar4,kVar5));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      testing::Message::~Message((Message *)0xf977a3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf97814);
    local_4b8 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffff8c8,0);
    local_50c = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                            (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(this_01,key);
    google::
    sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf97889);
    testing::internal::EqHelper::
    Compare<std::pair<const_int,_int>,_std::pair<const_int,_int>,_nullptr>
              (in_stack_fffffffffffff8e8,
               (char *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
               in_stack_fffffffffffff8d8,
               (pair<const_int,_int> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0)
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4b0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff900);
      testing::AssertionResult::failure_message((AssertionResult *)0xf978f7);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff900,TVar14,
                 (char *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                 (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffff950,(Message *)CONCAT44(kVar4,kVar5));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      testing::Message::~Message((Message *)0xf97954);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf979c5);
    local_538 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                            (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
    this_00 = (AssertHelper *)
              google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                      (key_type *)in_stack_fffffffffffff8c8);
    local_531 = this_00 == (AssertHelper *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
               (bool *)in_stack_fffffffffffff8c8,(type *)0xf97a2d);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_530);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(kVar4,kVar5),
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff940)),
                 (char *)actual_predicate_value,(char *)CONCAT44(kVar6,in_stack_fffffffffffff930));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,TVar14,
                 (char *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                 (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffff950,(Message *)CONCAT44(kVar4,kVar5));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      std::__cxx11::string::~string(local_568);
      testing::Message::~Message((Message *)0xf97b02);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf97b99);
    vVar10 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffff8c8,0);
    TVar14 = vVar10.second;
    kVar7 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                        (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(this_01,key);
    google::
    sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf97c0e);
    testing::internal::EqHelper::
    Compare<std::pair<const_int,_int>,_std::pair<const_int,_int>,_nullptr>
              (in_stack_fffffffffffff8e8,
               (char *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
               in_stack_fffffffffffff8d8,
               (pair<const_int,_int> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0)
              );
    line = (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20);
    iVar13 = (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_578);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0xf97c7c);
      line = (int)((ulong)pcVar11 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                (this_00,TVar14,(char *)CONCAT44(kVar7,in_stack_fffffffffffff8f0),line,
                 (char *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffff950,(Message *)CONCAT44(kVar4,kVar5));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      testing::Message::~Message((Message *)0xf97cd9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf97d4a);
    kVar8 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),iVar13);
    local_600 = kVar8;
    sVar12 = google::
             BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (key_type *)in_stack_fffffffffffff8c8);
    local_5f9 = sVar12 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
               (bool *)in_stack_fffffffffffff8c8,(type *)0xf97db2);
    iVar13 = (int)(sVar12 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffa08);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(kVar4,kVar5),
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff940)),
                 (char *)actual_predicate_value,(char *)CONCAT44(kVar6,in_stack_fffffffffffff930));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,TVar14,(char *)CONCAT44(kVar7,in_stack_fffffffffffff8f0),line,
                 (char *)CONCAT44(kVar8,in_stack_fffffffffffff8e0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffff950,(Message *)CONCAT44(kVar4,kVar5));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      std::__cxx11::string::~string(local_630);
      testing::Message::~Message((Message *)0xf97e87);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf97f1e);
    kVar9 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(kVar8,in_stack_fffffffffffff8e0),iVar13);
    local_648 = kVar9;
    success = (bool *)google::
                      BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)CONCAT44(kVar9,in_stack_fffffffffffff8d0),
                              (key_type *)in_stack_fffffffffffff8c8);
    local_641 = success == (bool *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(kVar9,in_stack_fffffffffffff8d0),success,(type *)0xf97f84
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_640);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(kVar4,kVar5),
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff940)),
                 (char *)actual_predicate_value,(char *)CONCAT44(kVar6,in_stack_fffffffffffff930));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,TVar14,(char *)CONCAT44(kVar7,in_stack_fffffffffffff8f0),line,
                 (char *)CONCAT44(kVar8,in_stack_fffffffffffff8e0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffff950,(Message *)CONCAT44(kVar4,kVar5));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(kVar9,in_stack_fffffffffffff8d0));
      std::__cxx11::string::~string(local_678);
      testing::Message::~Message((Message *)0xf98059);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf980ed);
    google::
    HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashMap
              ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf980fa);
    std::__cxx11::stringstream::~stringstream(local_2d0);
    google::
    HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashMap
              ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf98114);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, SerializingToStringStream) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  std::stringstream string_buffer;
  EXPECT_TRUE(ht_out.serialize(typename TypeParam::NopointerSerializer(),
                               &string_buffer));

  TypeParam ht_in;
  EXPECT_TRUE(ht_in.unserialize(typename TypeParam::NopointerSerializer(),
                                &string_buffer));

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}